

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PushColumnsBackground(void)

{
  int iVar1;
  ImGuiColumns *pIVar2;
  ImGuiWindow *draw_list;
  int cmd_size;
  ImDrawListSplitter *unaff_retaddr;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImVec2 *in_stack_00000018;
  ImVec2 *in_stack_00000020;
  
  draw_list = GetCurrentWindowRead();
  pIVar2 = (draw_list->DC).CurrentColumns;
  if (pIVar2->Count != 1) {
    ImDrawListSplitter::SetCurrentChannel
              (unaff_retaddr,(ImDrawList *)draw_list,(int)((ulong)pIVar2 >> 0x20));
    iVar1 = (draw_list->DrawList->CmdBuffer).Size;
    PushClipRect(in_stack_00000020,in_stack_00000018,window._7_1_);
    if (iVar1 != (draw_list->DrawList->CmdBuffer).Size) {
      __assert_fail("cmd_size == window->DrawList->CmdBuffer.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x1d84,"void ImGui::PushColumnsBackground()");
    }
  }
  return;
}

Assistant:

void ImGui::PushColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;
    columns->Splitter.SetCurrentChannel(window->DrawList, 0);
    int cmd_size = window->DrawList->CmdBuffer.Size;
    PushClipRect(columns->HostClipRect.Min, columns->HostClipRect.Max, false);
    IM_UNUSED(cmd_size);
    IM_ASSERT(cmd_size == window->DrawList->CmdBuffer.Size); // Being in channel 0 this should not have created an ImDrawCmd
}